

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O3

string * cm::operator+=(string *s,
                       StringOpPlus<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                       *a)

{
  std::__cxx11::string::reserve((ulong)s);
  std::__cxx11::string::append((char *)s,(ulong)(a->l)._M_str);
  std::__cxx11::string::append((char *)s,(ulong)(a->r)._M_str);
  return s;
}

Assistant:

std::string& operator+=(std::string& s, StringOpPlus<L, R> const& a)
{
  s.reserve(s.size() + a.size());
  s += a.l;
  s += a.r;
  return s;
}